

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TextureCubeMapArrayGenerateMipMapNonFilterable::iterate
          (TextureCubeMapArrayGenerateMipMapNonFilterable *this)

{
  ostringstream *this_00;
  long lVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  pointer pSVar4;
  TestError *this_01;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar3;
  
  initTest(this);
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  pSVar4 = (this->m_non_filterable_texture_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      (**(code **)(lVar3 + 0xb8))(0x9009,pSVar4[uVar5].m_to_id);
      err = (**(code **)(lVar3 + 0x800))();
      glu::checkError(err,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,0x293);
      (**(code **)(lVar3 + 0x710))(0x9009);
      iVar2 = (**(code **)(lVar3 + 0x800))();
      if (iVar2 != 0x502) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "glGenerateMipmap() operating on an non-filterable internalformat did not report GL_INVALID_OPERATION as per spec but "
                   ,0x75);
        std::ostream::operator<<(this_00,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," instead.",9);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Invalid error code reported for an invalid glGenerateMipmap() call.",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                   ,0x2a1);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pSVar4 = (this->m_non_filterable_texture_configs).
               super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->m_non_filterable_texture_configs).
                     super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 2) *
              -0x3333333333333333;
      bVar7 = uVar6 <= uVar5;
      lVar1 = uVar5 - uVar6;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar7 && lVar1 != 0);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArrayGenerateMipMapNonFilterable::iterate()
{
	/* Initialize ES objects used by the test */
	initTest();

	/* Verify that glGenerateMipmap() always throws GL_INVALID_OPERATION, if the
	 * texture object the call would operate on uses non-filterable internalformat.
	 */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int n_storage_config = 0; n_storage_config < m_non_filterable_texture_configs.size();
		 ++n_storage_config)
	{
		gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_non_filterable_texture_configs[n_storage_config].m_to_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.generateMipmap(GL_TEXTURE_CUBE_MAP_ARRAY);

		/* What's the error code at this point? */
		int error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "glGenerateMipmap() operating on an non-filterable internalformat "
								  "did not report GL_INVALID_OPERATION as per spec but "
							   << error_code << " instead." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid error code reported for an invalid glGenerateMipmap() call.");
		}
	} /* for (all storage configs) */

	/* The test has passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}